

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

void __thiscall
CTcParser::insert_propset_expansion(CTcParser *this,propset_def *propset_stack,int propset_depth)

{
  tc_toktyp_t tVar1;
  CTcTokenizer *this_00;
  int in_EDX;
  long in_RSI;
  propset_tok *cur_1;
  propset_tok *cur;
  int need_comma;
  propset_token_source *tok_src;
  int formals_found;
  int i;
  CTcTokenSource *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  CTcTokenizer *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  CTcToken *local_40;
  CTcToken *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar2;
  CTcTokenizer *pCVar3;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar4;
  int local_18;
  
  iVar4 = 0;
  local_18 = 0;
  do {
    if (in_EDX <= local_18) {
LAB_00266a7d:
      if (iVar4 != 0) {
        this_00 = (CTcTokenizer *)
                  operator_new(CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                               (CTcPrsMem *)in_stack_ffffffffffffff98);
        propset_token_source::propset_token_source
                  ((propset_token_source *)
                   CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
        propset_token_source::insert_token
                  ((propset_token_source *)CONCAT44(iVar4,in_stack_ffffffffffffffe0),
                   (tc_toktyp_t)((ulong)this_00 >> 0x20),
                   (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (size_t)in_stack_ffffffffffffffc8);
        iVar2 = 0;
        for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
          for (in_stack_ffffffffffffffc8 = *(CTcToken **)(in_RSI + (long)local_18 * 0x18 + 0x10);
              in_stack_ffffffffffffffc8 != (CTcToken *)0x0;
              in_stack_ffffffffffffffc8 = *(CTcToken **)(in_stack_ffffffffffffffc8 + 1)) {
            if (iVar2 != 0) {
              propset_token_source::insert_token
                        ((propset_token_source *)CONCAT44(iVar4,in_stack_ffffffffffffffe0),
                         (tc_toktyp_t)((ulong)this_00 >> 0x20),
                         (char *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                         (size_t)in_stack_ffffffffffffffc8);
              iVar2 = 0;
            }
            tVar1 = CTcToken::gettyp(in_stack_ffffffffffffffc8);
            if (((tVar1 == TOKT_COMMA) && (*(long *)(in_stack_ffffffffffffffc8 + 1) != 0)) &&
               (tVar1 = CTcToken::gettyp(*(CTcToken **)(in_stack_ffffffffffffffc8 + 1)),
               tVar1 == TOKT_TIMES)) {
              iVar2 = 1;
              break;
            }
            tVar1 = CTcToken::gettyp(in_stack_ffffffffffffffc8);
            if (tVar1 == TOKT_TIMES) break;
            propset_token_source::insert_token
                      ((propset_token_source *)
                       CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                       (CTcToken *)in_stack_ffffffffffffffa8);
          }
        }
        tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x266bc8);
        local_18 = in_EDX;
        if (tVar1 == TOKT_LPAR) {
          CTcTokenizer::next(in_stack_ffffffffffffffa8);
          tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x266bef);
          if (tVar1 != TOKT_RPAR) {
            if (iVar2 != 0) {
              propset_token_source::insert_token
                        ((propset_token_source *)CONCAT44(iVar4,in_stack_ffffffffffffffe0),
                         (tc_toktyp_t)((ulong)this_00 >> 0x20),
                         (char *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                         (size_t)in_stack_ffffffffffffffc8);
            }
            iVar2 = 1;
          }
          while( true ) {
            tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x266c2f);
            in_stack_ffffffffffffffb7 = false;
            if (tVar1 != TOKT_RPAR) {
              tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x266c4b);
              in_stack_ffffffffffffffb7 = tVar1 != TOKT_EOF;
            }
            if ((bool)in_stack_ffffffffffffffb7 == false) break;
            pCVar3 = this_00;
            CTcTokenizer::getcur(G_tok);
            propset_token_source::insert_token
                      ((propset_token_source *)
                       CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                       (CTcToken *)this_00);
            CTcTokenizer::next(this_00);
            in_stack_ffffffffffffffa8 = this_00;
            this_00 = pCVar3;
          }
          tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x266ca5);
          if (tVar1 == TOKT_RPAR) {
            CTcTokenizer::next(in_stack_ffffffffffffffa8);
          }
        }
        while (local_18 != 0) {
          local_18 = local_18 + -1;
          local_40 = *(CTcToken **)(in_RSI + (long)local_18 * 0x18 + 0x10);
          while( true ) {
            in_stack_ffffffffffffffa7 = false;
            if (local_40 != (CTcToken *)0x0) {
              tVar1 = CTcToken::gettyp(local_40);
              in_stack_ffffffffffffffa7 = tVar1 != TOKT_TIMES;
            }
            if ((bool)in_stack_ffffffffffffffa7 == false) break;
            local_40 = *(CTcToken **)(local_40 + 1);
          }
          if (local_40 != (CTcToken *)0x0) {
            local_40 = *(CTcToken **)(local_40 + 1);
          }
          if ((local_40 != (CTcToken *)0x0) &&
             (tVar1 = CTcToken::gettyp(local_40), tVar1 == TOKT_COMMA)) {
            local_40 = *(CTcToken **)(local_40 + 1);
          }
          for (; local_40 != (CTcToken *)0x0; local_40 = *(CTcToken **)(local_40 + 1)) {
            if (iVar2 != 0) {
              propset_token_source::insert_token
                        ((propset_token_source *)CONCAT44(iVar4,in_stack_ffffffffffffffe0),
                         (tc_toktyp_t)((ulong)this_00 >> 0x20),
                         (char *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                         (size_t)in_stack_ffffffffffffffc8);
              iVar2 = 0;
            }
            propset_token_source::insert_token
                      ((propset_token_source *)
                       CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                       (CTcToken *)in_stack_ffffffffffffffa8);
          }
        }
        propset_token_source::insert_token
                  ((propset_token_source *)CONCAT44(iVar4,in_stack_ffffffffffffffe0),
                   (tc_toktyp_t)((ulong)this_00 >> 0x20),
                   (char *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                   (size_t)in_stack_ffffffffffffffc8);
        CTcTokenizer::set_external_source
                  ((CTcTokenizer *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff98);
      }
      return;
    }
    if (*(long *)(in_RSI + (long)local_18 * 0x18 + 0x10) != 0) {
      iVar4 = 1;
      goto LAB_00266a7d;
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

void CTcParser::insert_propset_expansion(struct propset_def *propset_stack,
                                         int propset_depth)
{
    /* 
     *   First, determine if we have any added formals from propertyset
     *   definitions.  
     */
    int i;
    int formals_found;
    for (formals_found = FALSE, i = 0 ; i < propset_depth ; ++i)
    {
        /* if this one has formals, so note */
        if (propset_stack[i].param_tok_head != 0)
        {
            /* note it, and we need not look further */
            formals_found = TRUE;
            break;
        }
    }
    
    /*
     *   If we found formals from property sets, we must expand them into the
     *   token stream.  
     */
    if (formals_found)
    {
        /* insert an open paren at the start of the expansion list */
		propset_token_source *tok_src = new (G_prsmem) propset_token_source;
        tok_src->insert_token(TOKT_LPAR, "(", 1);
        
        /* we don't yet need a leading comma */
        int need_comma = FALSE;
        
        /*
         *   Add the tokens from each propertyset in the stack, from the
         *   outside in, until we reach an asterisk in each stack.  
         */
        for (i = 0 ; i < propset_depth ; ++i)
        {
            propset_tok *cur;
            
            /* add the tokens from the stack element */
            for (cur = propset_stack[i].param_tok_head ; cur != 0 ;
                 cur = cur->nxt)
            {
                /*
                 *   If we need a comma before the next real element, add it
                 *   now.  
                 */
                if (need_comma)
                {
                    tok_src->insert_token(TOKT_COMMA, ",", 1);
                    need_comma = FALSE;
                }
                
                /*
                 *   If this is a comma and the next item is the '*', omit
                 *   the comma - if we have nothing more following, we want
                 *   to suppress the comma.  
                 */
                if (cur->tok.gettyp() == TOKT_COMMA
                    && cur->nxt != 0
                    && cur->nxt->tok.gettyp() == TOKT_TIMES)
                {
                    /* 
                     *   it's the comma before the star - simply stop here
                     *   for this list, but note that we need a comma before
                     *   any additional formals that we add in the future 
                     */
                    need_comma = TRUE;
                    break;
                }
                
                /* 
                 *   if it's the '*' for this list, stop here, since we want
                 *   to insert the next level in before we add these tokens 
                 */
                if (cur->tok.gettyp() == TOKT_TIMES)
                    break;
                
                /* insert it into our expansion list */
                tok_src->insert_token(&cur->tok);
            }
        }
        
        /*
         *   If we have explicit formals in the true input stream, add them,
         *   up to but not including the close paren.  
         */
        if (G_tok->cur() == TOKT_LPAR)
        {
            /* skip the open paren */
            G_tok->next();
            
            /* check for a non-empty list */
            if (G_tok->cur() != TOKT_RPAR)
            {
                /* 
                 *   the list is non-empty - if we need a comma, add it now 
                 */
                if (need_comma)
                    tok_src->insert_token(TOKT_COMMA, ",", 1);
                
                /* we will need a comma at the end of this list */
                need_comma = TRUE;
            }
            
            /* 
             *   copy everything up to but not including the close paren to
             *   the expansion list 
             */
            while (G_tok->cur() != TOKT_RPAR
                   && G_tok->cur() != TOKT_EOF)
            {
                /* insert this token into our expansion list */
                tok_src->insert_token(G_tok->getcur());
                
                /* skip it */
                G_tok->next();
            }
            
            /* skip the closing paren */
            if (G_tok->cur() == TOKT_RPAR)
                G_tok->next();
        }
        
        /* 
         *   Finish the expansion by adding the parts of each propertyset
         *   list after the '*' to the expansion list.  Copy from the inside
         *   out, since we want to unwind the nesting from outside in that we
         *   did to start with.  
         */
        for (i = propset_depth ; i != 0 ; )
        {
            /* move down to the next level */
            --i;
            
            /* find the '*' in this list */
            propset_tok *cur;
            for (cur = propset_stack[i].param_tok_head ;
                 cur != 0 && cur->tok.gettyp() != TOKT_TIMES ;
                 cur = cur->nxt) ;
            
            /* if we found the '*', skip it */
            if (cur != 0)
                cur = cur->nxt;
            
            /* 
             *   also skip the comma following the '*', if present - we'll
             *   explicitly insert the needed extra comma if we actually find
             *   we need one 
             */
            if (cur != 0 && cur->tok.gettyp() == TOKT_COMMA)
                cur = cur->nxt;
            
            /* insert the remainder of the list into the expansion list */
            for ( ; cur != 0 ; cur = cur->nxt)
            {
                /* if we need a comma, add it now */
                if (need_comma)
                {
                    tok_src->insert_token(TOKT_COMMA, ",", 1);
                    need_comma = FALSE;
                }
                
                /* insert this token */
                tok_src->insert_token(&cur->tok);
            }
        }
        
        /* add the closing paren at the end of the expansion list */
        tok_src->insert_token(TOKT_RPAR, ")", 1);
        
        /*
         *   We've fully expanded the formal list.  Now all that remains is
         *   to insert the expanded token list into the token input stream,
         *   so that we read from the expanded list instead of from the
         *   original token stream.  
         */
        G_tok->set_external_source(tok_src);
    }
}